

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2.c
# Opt level: O1

int main(void)

{
  int iVar1;
  char *__s;
  unqlite_vm *pVm;
  unqlite *pDb;
  char *zBuf;
  int iLen;
  unqlite_vm *local_28;
  unqlite *local_20;
  char *local_18;
  int local_c;
  
  puts(
      "============================================================\nUnQLite (Via Jx9) Constant Expansion Mechanism              \n                                         http://unqlite.org/\n============================================================\n"
      );
  iVar1 = unqlite_open(&local_20,":mem:",4);
  if (iVar1 == 0) {
    iVar1 = unqlite_compile(local_20,
                            "print \'__PI__   value: \' .. __PI__ ..   JX9_EOL;print \'__TIME__ value: \' .. __TIME__ .. JX9_EOL;print \'__OS__   value: \' .. __OS__ ..   JX9_EOL;"
                            ,0x90,&local_28);
    if (iVar1 != 0) {
      unqlite_config(local_20,1,&local_18,&local_c);
      if (0 < local_c) {
        puts(local_18);
      }
      __s = "Jx9 compile error";
      goto LAB_0010a648;
    }
    iVar1 = unqlite_create_constant(local_28,"__PI__",PI_Constant,(void *)0x0);
    if (iVar1 != 0) {
      __s = "Error while installing the __PI__ constant";
      goto LAB_0010a648;
    }
    iVar1 = unqlite_create_constant(local_28,"__TIME__",TIME_Constant,(void *)0x0);
    if (iVar1 != 0) {
      __s = "Error while installing the __TIME__ constant";
      goto LAB_0010a648;
    }
    iVar1 = unqlite_create_constant(local_28,"__OS__",OS_Constant,(void *)0x0);
    if (iVar1 != 0) {
      __s = "Error while installing the __OS__ constant";
      goto LAB_0010a648;
    }
    iVar1 = unqlite_vm_config(local_28,1,VmOutputConsumer,0);
    if (iVar1 == 0) {
      iVar1 = unqlite_vm_exec(local_28);
      if (iVar1 == 0) {
        unqlite_vm_release(local_28);
        unqlite_close(local_20);
        return 0;
      }
    }
    Fatal(local_20,(char *)0x0);
  }
  __s = "Out of memory";
LAB_0010a648:
  puts(__s);
  unqlite_lib_shutdown();
  exit(0);
}

Assistant:

int main(void)
{
	unqlite *pDb;       /* Database handle */
	unqlite_vm *pVm;    /* UnQLite VM resulting from successful compilation of the target Jx9 script */
	int rc;

	puts(zBanner);

	/* Open our database */
	rc = unqlite_open(&pDb,":mem:" /* In-mem DB */,UNQLITE_OPEN_CREATE);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Out of memory");
	}
	
	/* Compile our Jx9 script defined above */
	rc = unqlite_compile(pDb,JX9_PROG,sizeof(JX9_PROG)-1,&pVm);
	if( rc != UNQLITE_OK ){
		/* Compile error, extract the compiler error log */
		const char *zBuf;
		int iLen;
		/* Extract error log */
		unqlite_config(pDb,UNQLITE_CONFIG_JX9_ERR_LOG,&zBuf,&iLen);
		if( iLen > 0 ){
			puts(zBuf);
		}
		Fatal(0,"Jx9 compile error");
	}

	/* Now we have our program compiled, it's time to register our constants
	 * and their associated C procedure.
	 */
	rc = unqlite_create_constant(pVm, "__PI__", PI_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __PI__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__TIME__", TIME_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __TIME__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__OS__", OS_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __OS__ constant");
	}

	/* Install a VM output consumer callback */
	rc = unqlite_vm_config(pVm,UNQLITE_VM_CONFIG_OUTPUT,VmOutputConsumer,0);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}
	
	/* Execute our script */
	rc = unqlite_vm_exec(pVm);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}

	/* Release our VM */
	unqlite_vm_release(pVm);
	
	/* Auto-commit the transaction and close our database */
	unqlite_close(pDb);
	return 0;
}